

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O2

void advance_lfo(FM_OPL *OPL)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = OPL->lfo_am_cnt + OPL->lfo_am_inc;
  uVar1 = OPL->lfo_am_cnt + 0x2e000000 + OPL->lfo_am_inc;
  if (uVar2 < 0xd2000000) {
    uVar1 = uVar2;
  }
  OPL->lfo_am_cnt = uVar1;
  bVar3 = ""[uVar1 >> 0x18] >> 2;
  if (OPL->lfo_am_depth != '\0') {
    bVar3 = ""[uVar1 >> 0x18];
  }
  LFO_AM = (UINT32)bVar3;
  uVar2 = OPL->lfo_pm_cnt + OPL->lfo_pm_inc;
  OPL->lfo_pm_cnt = uVar2;
  LFO_PM = (uint)OPL->lfo_pm_depth_range | uVar2 >> 0x18 & 7;
  return;
}

Assistant:

INLINE void advance_lfo(FM_OPL *OPL)
{
	UINT8 tmp;

	/* LFO */
	OPL->lfo_am_cnt += OPL->lfo_am_inc;
	if (OPL->lfo_am_cnt >= (UINT32)(LFO_AM_TAB_ELEMENTS<<LFO_SH) )	/* lfo_am_table is 210 elements long */
		OPL->lfo_am_cnt -= (LFO_AM_TAB_ELEMENTS<<LFO_SH);

	tmp = lfo_am_table[ OPL->lfo_am_cnt >> LFO_SH ];

	if (OPL->lfo_am_depth)
		LFO_AM = tmp;
	else
		LFO_AM = tmp>>2;

	OPL->lfo_pm_cnt += OPL->lfo_pm_inc;
	LFO_PM = ((OPL->lfo_pm_cnt>>LFO_SH) & 7) | OPL->lfo_pm_depth_range;
}